

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCone.c
# Opt level: O2

Vec_Wrd_t * Gia_ManDeriveSigns(Gia_Man_t *p,Vec_Int_t *vPivots,int fVerbose)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Gia_Obj_t *pGVar4;
  Vec_Wrd_t *p_00;
  word *pwVar5;
  word wVar6;
  word wVar7;
  Gia_Obj_t *pObj;
  ulong uVar8;
  uint uVar9;
  uint local_38;
  
  Gia_ManFillValue(p);
  for (uVar9 = 0; (int)uVar9 < vPivots->nSize; uVar9 = uVar9 + 1) {
    iVar2 = Vec_IntEntry(vPivots,uVar9);
    pGVar4 = Gia_ManObj(p,iVar2);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    pGVar4->Value = uVar9;
  }
  if (fVerbose != 0) {
    printf("Signature propagation: ");
  }
  iVar2 = p->nObjs;
  p_00 = Vec_WrdAlloc(iVar2);
  p_00->nSize = iVar2;
  memset(p_00->pArray,0,(long)iVar2 << 3);
  bVar1 = true;
  do {
    if (!bVar1) {
      if (fVerbose != 0) {
        putchar(10);
      }
      return p_00;
    }
    for (iVar2 = 0; iVar2 < p->nObjs; iVar2 = iVar2 + 1) {
      pGVar4 = Gia_ManObj(p,iVar2);
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      uVar9 = pGVar4->Value;
      if (uVar9 != 0xffffffff) {
        if (0x3f < uVar9) {
          __assert_fail("pObj->Value >= 0 && pObj->Value < 64",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCone.c"
                        ,0x1bf,"Vec_Wrd_t *Gia_ManDeriveSigns(Gia_Man_t *, Vec_Int_t *, int)");
        }
        pwVar5 = Vec_WrdEntryP(p_00,iVar2);
        *pwVar5 = *pwVar5 | 1L << ((byte)uVar9 & 0x3f);
      }
      uVar9 = (uint)*(ulong *)pGVar4;
      uVar8 = *(ulong *)pGVar4 & 0x1fffffff;
      if (uVar8 == 0x1fffffff || (int)uVar9 < 0) {
        if ((int)uVar9 < 0 && (int)uVar8 != 0x1fffffff) {
          wVar6 = Vec_WrdEntry(p_00,iVar2 - (uVar9 & 0x1fffffff));
          pwVar5 = Vec_WrdEntryP(p_00,iVar2);
          *pwVar5 = *pwVar5 | wVar6;
        }
      }
      else {
        wVar6 = Vec_WrdEntry(p_00,iVar2 - (uVar9 & 0x1fffffff));
        wVar7 = Vec_WrdEntry(p_00,iVar2 - (*(uint *)&pGVar4->field_0x4 & 0x1fffffff));
        pwVar5 = Vec_WrdEntryP(p_00,iVar2);
        *pwVar5 = *pwVar5 | wVar7 | wVar6;
      }
    }
    bVar1 = false;
    local_38 = 0;
    for (iVar2 = 0; iVar2 < p->nRegs; iVar2 = iVar2 + 1) {
      pGVar4 = Gia_ManCo(p,(p->vCos->nSize - p->nRegs) + iVar2);
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      iVar3 = Vec_IntEntry(p->vCis,(p->vCis->nSize - p->nRegs) + iVar2);
      pObj = Gia_ManObj(p,iVar3);
      if (pObj == (Gia_Obj_t *)0x0) break;
      iVar3 = Gia_ObjId(p,pObj);
      wVar6 = Vec_WrdEntry(p_00,iVar3);
      iVar3 = Gia_ObjId(p,pGVar4);
      wVar7 = Vec_WrdEntry(p_00,iVar3);
      iVar3 = Gia_ObjId(p,pObj);
      pwVar5 = Vec_WrdEntryP(p_00,iVar3);
      *pwVar5 = *pwVar5 | wVar7;
      iVar3 = Gia_ObjId(p,pObj);
      wVar7 = Vec_WrdEntry(p_00,iVar3);
      if (wVar6 != wVar7) {
        bVar1 = true;
      }
      local_38 = local_38 + (wVar6 != wVar7);
    }
    if (fVerbose != 0) {
      printf("%d ",(ulong)local_38);
    }
  } while( true );
}

Assistant:

Vec_Wrd_t * Gia_ManDeriveSigns( Gia_Man_t * p, Vec_Int_t * vPivots, int fVerbose )
{
    Vec_Wrd_t * vSigns;
    Gia_Obj_t * pObj, * pObjRi;
    int i, fChange = 1, Counter;

    Gia_ManFillValue( p );
    Gia_ManForEachObjVec( vPivots, p, pObj, i )
        pObj->Value = i;

    if ( fVerbose )
        printf( "Signature propagation: " );
    vSigns = Vec_WrdStart( Gia_ManObjNum(p) );
    while ( fChange )
    {
        fChange = 0;
        Gia_ManForEachObj( p, pObj, i )
        {
            if ( ~pObj->Value )
            {
                assert( pObj->Value >= 0 && pObj->Value < 64 );
                *Vec_WrdEntryP( vSigns, i ) |= ( (word)1 << pObj->Value );
            }
            if ( Gia_ObjIsAnd(pObj) )
                *Vec_WrdEntryP( vSigns, i ) |= Vec_WrdEntry(vSigns, Gia_ObjFaninId0(pObj, i)) | Vec_WrdEntry(vSigns, Gia_ObjFaninId1(pObj, i));
            else if ( Gia_ObjIsCo(pObj) )
                *Vec_WrdEntryP( vSigns, i ) |= Vec_WrdEntry(vSigns, Gia_ObjFaninId0(pObj, i));
        }
        Counter = 0;
        Gia_ManForEachRiRo( p, pObjRi, pObj, i )
        {
            word Value = Vec_WrdEntry(vSigns, Gia_ObjId(p, pObj));
            *Vec_WrdEntryP( vSigns, Gia_ObjId(p, pObj) ) |= Vec_WrdEntry(vSigns, Gia_ObjId(p, pObjRi));
            if ( Value != Vec_WrdEntry(vSigns, Gia_ObjId(p, pObj)) )
                fChange = 1, Counter++;
        }
        if ( fVerbose )
            printf( "%d ", Counter );
    }
    if ( fVerbose )
       printf( "\n" );
    return vSigns;
}